

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ublox.cpp
# Opt level: O0

int __thiscall Ublox::testConnection(Ublox *this)

{
  int iVar1;
  Ublox *in_RDI;
  uchar *unaff_retaddr;
  char *in_stack_00000008;
  uchar from_gps_data;
  uchar to_gps_data;
  int count;
  int status;
  undefined6 in_stack_ffffffffffffffe0;
  undefined1 uVar2;
  undefined1 uVar3;
  int local_18;
  int in_stack_ffffffffffffffec;
  uchar bits_per_word;
  Ublox *pUVar4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  local_18 = 0;
  uVar3 = 0;
  uVar2 = 0;
  pUVar4 = in_RDI;
  iVar1 = enableNAV_POSLLH(in_RDI);
  if (iVar1 < 0) {
    std::operator<<((ostream *)&std::cerr,"Could not configure ublox over SPI\n");
  }
  iVar1 = enableNAV_STATUS(in_RDI);
  if (iVar1 < 0) {
    std::operator<<((ostream *)&std::cerr,"Could not configure ublox over SPI\n");
  }
  iVar1 = enableNAV_TIMEGPS(in_RDI);
  if (iVar1 < 0) {
    std::operator<<((ostream *)&std::cerr,"Could not configure ublox over SPI\n");
  }
  do {
    bits_per_word = (uchar)((uint)in_stack_ffffffffffffffec >> 0x18);
    if (0x1ff < local_18) {
      return 0;
    }
    std::__cxx11::string::c_str();
    SPIdev::transfer(in_stack_00000008,unaff_retaddr,
                     (uchar *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     (uint)((ulong)pUVar4 >> 0x20),(uint)pUVar4,bits_per_word,(unsigned_short)count)
    ;
    in_stack_ffffffffffffffec =
         UBXScanner::update((UBXScanner *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffffe0)),
                            (uchar)((ulong)in_RDI >> 0x38));
    if (in_stack_ffffffffffffffec == 9) {
      iVar1 = UBXParser::checkMessage
                        ((UBXParser *)CONCAT17(uVar3,CONCAT16(uVar2,in_stack_ffffffffffffffe0)));
      if (iVar1 == 1) {
        UBXScanner::reset(in_RDI->scanner);
        return 1;
      }
      UBXScanner::reset(in_RDI->scanner);
    }
    local_18 = local_18 + 1;
  } while( true );
}

Assistant:

int Ublox::testConnection()
{
    int status;
    int count = 0;
    unsigned char to_gps_data = 0x00, from_gps_data = 0x00;

    // we do this, so that at least one ubx message is enabled

    if (enableNAV_POSLLH()<0)
    {
        std::cerr << "Could not configure ublox over SPI\n";
    }

    if (enableNAV_STATUS()<0)
    {
        std::cerr << "Could not configure ublox over SPI\n";
    }

    if (enableNAV_TIMEGPS()<0)
    {
        std::cerr << "Could not configure ublox over SPI\n";
    }

    while (count < UBX_BUFFER_LENGTH/2)
    {
        // From now on, we will send zeroes to the receiver, which it will ignore
        // However, we are simultaneously getting useful information from it
        SPIdev::transfer(spi_device_name.c_str(), &to_gps_data, &from_gps_data, 1, 200000);

        // Scanner checks the message structure with every byte received
        status = scanner->update(from_gps_data);

        if (status == UBXScanner::Done)
        {
            // Once we have a full message we decode it and reset the scanner, making it look for another message
            // in the data stream, coming over SPI

            // If we find at least one valid message in the buffer, we consider connection to be established
            if(parser->checkMessage()==1)
            {
                scanner->reset();
                return 1;
            }

            scanner->reset();
        }

        count++;
    }

    return 0;
}